

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O1

bool32 rw::gl3::rasterFromImage(Raster *raster,Image *image)

{
  uint8 *puVar1;
  uint uVar2;
  bool32 bVar3;
  int iVar4;
  Image *this;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint8 *puVar8;
  code *pcVar9;
  uint8 *local_50;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  if (image->depth < 9) {
    this = Image::create(image->width,image->height,image->depth);
    this->pixels = image->pixels;
    this->stride = image->stride;
    this->palette = image->palette;
    Image::unpalettize(this,false);
    image = this;
  }
  else {
    this = (Image *)0x0;
  }
  lVar7 = (long)nativeRasterOffset;
  uVar2 = raster->format & 0xf00;
  uVar5 = image->depth << 0x1e | image->depth - 4U >> 2;
  if (uVar5 == 3) {
    if (gl3Caps == 0) {
      if (uVar2 != 0x100) goto LAB_00118bbe;
      pcVar9 = conv_RGBA5551_from_ARGB1555;
    }
    else {
      pcVar9 = conv_RGBA8888_from_ARGB1555;
    }
  }
  else {
    if (uVar5 == 5) {
      pcVar9 = conv_RGBA8888_from_RGB888;
    }
    else {
      if (uVar5 != 7) goto LAB_00118bbe;
      pcVar9 = conv_RGBA8888_from_RGBA8888;
    }
    if ((gl3Caps == 0) && (uVar2 != 0x500)) {
      if (uVar2 != 0x600) {
LAB_00118bbe:
        rasterFromImage();
        return 0;
      }
      pcVar9 = conv_RGB888_from_RGB888;
    }
  }
  bVar3 = Image::hasAlpha(image);
  *(bool *)((long)&raster->width + lVar7 + 1) = bVar3 != 0;
  puVar1 = raster->pixels;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,5);
  }
  if (0 < image->height) {
    local_50 = raster->pixels;
    iVar4 = 0;
    do {
      if (0 < image->width) {
        iVar6 = 0;
        puVar8 = local_50;
        do {
          (*pcVar9)(puVar8);
          puVar8 = puVar8 + *(int *)((long)&raster->privateFlags + lVar7);
          iVar6 = iVar6 + 1;
        } while (iVar6 < image->width);
      }
      local_50 = local_50 + raster->stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 < image->height);
  }
  if (puVar1 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  if (this != (Image *)0x0) {
    Image::destroy(this);
  }
  return 1;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	int32 format = raster->format&0xF00;
	assert(!natras->isCompressed);
	switch(image->depth){
	case 32:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_ARGB1555;
		else if(format == Raster::C1555)
			conv = conv_RGBA5551_from_ARGB1555;
		else
			goto err;
		break;

	case 8:
	case 4:
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	natras->hasAlpha = image->hasAlpha();

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}